

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O0

void Cba_BlastTable(Gia_Man_t *pNew,word *pTable,int *pFans,int nFans,int nOuts,Vec_Int_t *vRes)

{
  int iVar1;
  word *p;
  word wVar2;
  int nMints;
  int iLit;
  int m;
  int i;
  int o;
  word *pTruth;
  Vec_Int_t vLeaves;
  Vec_Int_t *vMemory;
  Vec_Int_t *vRes_local;
  int nOuts_local;
  int nFans_local;
  int *pFans_local;
  word *pTable_local;
  Gia_Man_t *pNew_local;
  
  vLeaves.pArray = &Vec_IntAlloc(0)->nCap;
  pTruth._0_4_ = nFans;
  pTruth._4_4_ = nFans;
  vLeaves._0_8_ = pFans;
  iVar1 = Abc_TtWordNum(nFans);
  p = (word *)malloc((long)iVar1 << 3);
  Vec_IntClear(vRes);
  for (m = 0; m < nOuts; m = m + 1) {
    iVar1 = Abc_TtWordNum(nFans);
    memset(p,0,(long)iVar1 << 3);
    for (nMints = 0; nMints < 1 << ((byte)nFans & 0x1f); nMints = nMints + 1) {
      for (iLit = 0; iLit < nFans; iLit = iLit + 1) {
        iVar1 = Abc_TtGetBit(pTable,nMints * nFans + iLit);
        if (iVar1 != 0) {
          Abc_TtSetBit(p,nMints);
        }
      }
    }
    if (nFans < 6) {
      wVar2 = Abc_Tt6Stretch(*p,nFans);
      *p = wVar2;
    }
    iVar1 = Kit_TruthToGia(pNew,(uint *)p,nFans,(Vec_Int_t *)vLeaves.pArray,(Vec_Int_t *)&pTruth,1);
    Vec_IntPush(vRes,iVar1);
  }
  Vec_IntFree((Vec_Int_t *)vLeaves.pArray);
  if (p != (word *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Cba_BlastTable( Gia_Man_t * pNew, word * pTable, int * pFans, int nFans, int nOuts, Vec_Int_t * vRes )
{
    extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
    Vec_Int_t * vMemory = Vec_IntAlloc( 0 );
    Vec_Int_t vLeaves = { nFans, nFans, pFans };
    word * pTruth = ABC_ALLOC( word, Abc_TtWordNum(nFans) );
    int o, i, m, iLit, nMints = (1 << nFans);
    Vec_IntClear( vRes );
    for ( o = 0; o < nOuts; o++ )
    {
        // derive truth table
        memset( pTruth, 0, sizeof(word) * Abc_TtWordNum(nFans) );
        for ( m = 0; m < nMints; m++ )
            for ( i = 0; i < nFans; i++ )
                if ( Abc_TtGetBit( pTable, m * nFans + i ) )
                    Abc_TtSetBit( pTruth, m );
        // implement truth table
        if ( nFans < 6 )
            pTruth[0] = Abc_Tt6Stretch( pTruth[0], nFans );
        iLit = Kit_TruthToGia( pNew, (unsigned *)pTruth, nFans, vMemory, &vLeaves, 1 );
        Vec_IntPush( vRes, iLit );
    }
    Vec_IntFree( vMemory );
    ABC_FREE( pTruth );
}